

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O0

void __thiscall
CombinedSeismogramm<float,_2>::AddComponent
          (CombinedSeismogramm<float,_2> *this,string *path,
          ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *getter)

{
  ComponentInfo local_48;
  ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *local_20;
  ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *getter_local;
  string *path_local;
  CombinedSeismogramm<float,_2> *this_local;
  
  local_20 = getter;
  getter_local = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)path;
  path_local = (string *)this;
  ComponentInfo::ComponentInfo(&local_48,path,getter);
  std::
  vector<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
  ::push_back(&this->componentInfos,&local_48);
  ComponentInfo::~ComponentInfo(&local_48);
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddComponent(const std::string& path, ValueGetter<Elastic, dims>* getter)
{
    componentInfos.push_back(ComponentInfo(path, getter));
}